

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RatioSequence.cpp
# Opt level: O3

RatioSequence *
RatioSequence::interleave
          (RatioSequence *__return_storage_ptr__,RatioSequence *rs1,RatioSequence *rs2)

{
  vector<Ratio,_std::allocator<Ratio>_> *this;
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  double dVar4;
  RatioSequence combined2;
  RatioSequence combined1;
  RatioSequence RStack_78;
  RatioSequence local_58;
  double local_38;
  
  getNonDesRSWithMinDist(&local_58,rs1);
  getNonDesRSWithMinDist(&RStack_78,rs2);
  (__return_storage_ptr__->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->combineCode = 0;
  (__return_storage_ptr__->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  this = &__return_storage_ptr__->_RatioSequence;
  std::vector<Ratio,_std::allocator<Ratio>_>::reserve
            (this,((long)RStack_78._RatioSequence.super__Vector_base<Ratio,_std::allocator<Ratio>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)RStack_78._RatioSequence.super__Vector_base<Ratio,_std::allocator<Ratio>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 6) +
                  ((long)local_58._RatioSequence.super__Vector_base<Ratio,_std::allocator<Ratio>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_58._RatioSequence.super__Vector_base<Ratio,_std::allocator<Ratio>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 6));
  if ((local_58._RatioSequence.super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
       super__Vector_impl_data._M_finish ==
       local_58._RatioSequence.super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
       super__Vector_impl_data._M_start) ||
     (RStack_78._RatioSequence.super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      RStack_78._RatioSequence.super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
      super__Vector_impl_data._M_start)) {
    uVar3 = 0;
    uVar1 = 0;
  }
  else {
    uVar3 = 0;
    uVar1 = 0;
    do {
      local_38 = Ratio::getRatio(local_58._RatioSequence.
                                 super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
                                 super__Vector_impl_data._M_start + uVar3);
      dVar4 = Ratio::getRatio(RStack_78._RatioSequence.
                              super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
                              super__Vector_impl_data._M_start + uVar1);
      if (local_38 <= dVar4) {
        std::vector<Ratio,_std::allocator<Ratio>_>::push_back
                  (this,local_58._RatioSequence.super__Vector_base<Ratio,_std::allocator<Ratio>_>.
                        _M_impl.super__Vector_impl_data._M_start + uVar3);
        uVar3 = uVar3 + 1;
      }
      else {
        std::vector<Ratio,_std::allocator<Ratio>_>::push_back
                  (this,RStack_78._RatioSequence.super__Vector_base<Ratio,_std::allocator<Ratio>_>.
                        _M_impl.super__Vector_impl_data._M_start + uVar1);
        uVar1 = uVar1 + 1;
      }
    } while ((uVar3 < (ulong)((long)local_58._RatioSequence.
                                    super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                              (long)local_58._RatioSequence.
                                    super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
                                    super__Vector_impl_data._M_start >> 6)) &&
            (uVar1 < (ulong)((long)RStack_78._RatioSequence.
                                   super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)RStack_78._RatioSequence.
                                   super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 6)));
  }
  if (uVar3 < (ulong)((long)local_58._RatioSequence.
                            super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_58._RatioSequence.
                            super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
                            super__Vector_impl_data._M_start >> 6)) {
    lVar2 = uVar3 << 6;
    do {
      std::vector<Ratio,_std::allocator<Ratio>_>::push_back
                (this,(value_type *)
                      ((long)&(local_58._RatioSequence.
                               super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
                               super__Vector_impl_data._M_start)->eLength + lVar2));
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x40;
    } while (uVar3 < (ulong)((long)local_58._RatioSequence.
                                   super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)local_58._RatioSequence.
                                   super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 6));
  }
  if (uVar1 < (ulong)((long)RStack_78._RatioSequence.
                            super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)RStack_78._RatioSequence.
                            super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
                            super__Vector_impl_data._M_start >> 6)) {
    lVar2 = uVar1 << 6;
    do {
      std::vector<Ratio,_std::allocator<Ratio>_>::push_back
                (this,(value_type *)
                      ((long)&(RStack_78._RatioSequence.
                               super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
                               super__Vector_impl_data._M_start)->eLength + lVar2));
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x40;
    } while (uVar1 < (ulong)((long)RStack_78._RatioSequence.
                                   super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)RStack_78._RatioSequence.
                                   super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 6));
  }
  std::vector<Ratio,_std::allocator<Ratio>_>::~vector(&RStack_78._RatioSequence);
  std::vector<Ratio,_std::allocator<Ratio>_>::~vector(&local_58._RatioSequence);
  return __return_storage_ptr__;
}

Assistant:

RatioSequence RatioSequence::interleave(RatioSequence& rs1, RatioSequence& rs2) {
    RatioSequence combined1 = rs1.getNonDesRSWithMinDist();
    RatioSequence combined2 = rs2.getNonDesRSWithMinDist();

    RatioSequence interleavedRS = RatioSequence();
    interleavedRS._RatioSequence.reserve(combined1.size() + combined2.size());
    size_t index1 = 0;  // index for stepping through combined1
    size_t index2 = 0;  // index for stepping through combined2
    while (index1 < combined1.size() && index2 < combined2.size()) {
        if (combined1[index1].getRatio() <= combined2[index2].getRatio()) {
            interleavedRS.push_back(combined1[index1]);
            index1++;
        } else {
            interleavedRS.push_back(combined2[index2]);
            index2++;
        }
    }
    // if we have finished adding rs2 but not rs1
    while (index1 < combined1.size()) {
        interleavedRS.push_back(combined1[index1]);
        index1++;
    }
    // if we have finished adding rs1 but not rs2
    while (index2 < combined2.size()) {
        interleavedRS.push_back(combined2[index2]);
        index2++;
    }
    return interleavedRS;
}